

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O2

void gauden_free(gauden_t *g)

{
  if (g != (gauden_t *)0x0) {
    if (g->mean != (mfcc_t ****)0x0) {
      gauden_param_free(g->mean);
    }
    if (g->var != (mfcc_t ****)0x0) {
      gauden_param_free(g->var);
    }
    if (g->det != (mfcc_t ***)0x0) {
      ckd_free_3d(g->det);
    }
    if (g->featlen != (int32 *)0x0) {
      ckd_free(g->featlen);
    }
    if (g->lmath != (logmath_t *)0x0) {
      logmath_free(g->lmath);
    }
    ckd_free(g);
    return;
  }
  return;
}

Assistant:

void
gauden_free(gauden_t * g)
{
    if (g == NULL)
        return;
    if (g->mean)
        gauden_param_free(g->mean);
    if (g->var)
        gauden_param_free(g->var);
    if (g->det)
        ckd_free_3d(g->det);
    if (g->featlen)
        ckd_free(g->featlen);
    if (g->lmath)
        logmath_free(g->lmath);
    ckd_free(g);
}